

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collision.cc
# Opt level: O2

Arbiter * apollonia::Collide(PolygonBody *pa,PolygonBody *pb)

{
  Vec2 VVar1;
  Vec2 VVar2;
  undefined1 auVar3 [16];
  Vec2 VVar4;
  Vec2 VVar5;
  uint __line;
  size_t sVar6;
  Arbiter *this;
  PolygonBody *pPVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  PolygonBody *this_00;
  pointer pCVar11;
  pointer pCVar12;
  char *__assertion;
  Contact *contact;
  PolygonBody *idx;
  ulong idx_00;
  byte bVar13;
  Float FVar14;
  Float FVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  Vec2 VVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  undefined1 auVar23 [16];
  float fVar24;
  initializer_list<apollonia::Contact> __l;
  float local_148;
  float fStack_144;
  Vec2 normal;
  size_t ia;
  undefined1 local_128 [8];
  float fStack_120;
  float fStack_11c;
  size_t ib;
  undefined1 local_108 [16];
  ContactList contacts;
  _Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_> local_d8;
  ContactList clipped_contacts;
  Contact local_78;
  
  bVar13 = 0;
  FVar14 = PolygonBody::FindMinSeparatingAxis(pa,&ia,pb);
  if ((0.0 <= FVar14) ||
     (FVar15 = PolygonBody::FindMinSeparatingAxis(pb,&ib,pa), sVar6 = ia, 0.0 <= FVar15)) {
    this = (Arbiter *)0x0;
  }
  else {
    this_00 = pa;
    if (FVar14 < FVar15) {
      ia = ib;
      ib = sVar6;
      this_00 = pb;
      pb = pa;
    }
    VVar4 = PolygonBody::EdgeAt(this_00,ia);
    fVar16 = VVar4.x;
    fVar18 = VVar4.y;
    auVar23._0_8_ = CONCAT44(fVar16,fVar18) ^ 0x8000000000000000;
    auVar23._8_4_ = fVar18;
    auVar23._12_4_ = fVar18;
    fVar16 = SQRT(fVar18 * fVar18 + fVar16 * fVar16);
    auVar21._4_4_ = fVar16;
    auVar21._0_4_ = fVar16;
    auVar21._8_4_ = fVar16;
    auVar21._12_4_ = fVar16;
    _local_128 = divps(auVar23,auVar21);
    normal = local_128;
    local_108._4_4_ = local_128._4_4_;
    local_108._0_4_ = local_108._4_4_;
    local_108._8_4_ = local_108._4_4_;
    local_108._12_4_ = local_108._4_4_;
    fVar16 = 3.4028235e+38;
    for (idx = (PolygonBody *)0x0;
        pPVar7 = (PolygonBody *)
                 ((long)(pb->vertices_).
                        super__Vector_base<apollonia::Vec2,_std::allocator<apollonia::Vec2>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(pb->vertices_).
                        super__Vector_base<apollonia::Vec2,_std::allocator<apollonia::Vec2>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 3), idx < pPVar7;
        idx = (PolygonBody *)((long)&(idx->super_Body)._vptr_Body + 1)) {
      VVar4 = PolygonBody::EdgeAt(pb,(size_t)idx);
      fVar18 = VVar4.x;
      fVar17 = VVar4.y;
      fVar22 = SQRT(fVar17 * fVar17 + fVar18 * fVar18);
      fVar18 = (fVar17 / fVar22) * (float)local_128._0_4_ -
               (fVar18 / fVar22) * (float)local_108._0_4_;
      pPVar7 = idx;
      if (fVar16 <= fVar18) {
        fVar18 = fVar16;
        pPVar7 = pa;
      }
      pa = pPVar7;
      fVar16 = fVar18;
    }
    Contact::Contact((Contact *)&clipped_contacts,pb,(size_t)pa);
    Contact::Contact(&local_78,pb,(ulong)((long)&(pa->super_Body)._vptr_Body + 1U) % (ulong)pPVar7);
    __l._M_len = 2;
    __l._M_array = (Contact *)&clipped_contacts;
    std::vector<apollonia::Contact,_std::allocator<apollonia::Contact>_>::vector
              (&contacts,__l,(allocator_type *)&local_d8);
    std::vector<apollonia::Contact,_std::allocator<apollonia::Contact>_>::vector
              (&clipped_contacts,&contacts);
    this = (Arbiter *)0x0;
    idx_00 = 0;
    while (idx_00 < (ulong)((long)(this_00->vertices_).
                                  super__Vector_base<apollonia::Vec2,_std::allocator<apollonia::Vec2>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this_00->vertices_).
                                  super__Vector_base<apollonia::Vec2,_std::allocator<apollonia::Vec2>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3)) {
      if (idx_00 == ia) {
        idx_00 = idx_00 + 1;
      }
      else {
        VVar4 = PolygonBody::operator[](this_00,idx_00);
        local_128._0_4_ = (this_00->super_Body).position_.x;
        local_108._0_4_ = (this_00->super_Body).position_.y;
        VVar5 = PolygonBody::operator[]
                          (this_00,(idx_00 + 1) %
                                   (ulong)((long)(this_00->vertices_).
                                                 super__Vector_base<apollonia::Vec2,_std::allocator<apollonia::Vec2>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)(this_00->vertices_).
                                                 super__Vector_base<apollonia::Vec2,_std::allocator<apollonia::Vec2>_>
                                                 ._M_impl.super__Vector_impl_data._M_start >> 3));
        local_148 = VVar4.x;
        fStack_144 = VVar4.y;
        fStack_144 = fStack_144 + (float)local_108._0_4_;
        local_148 = (float)local_128._0_4_ + local_148;
        fVar24 = ((this_00->super_Body).position_.x + VVar5.x) - local_148;
        fVar17 = (VVar5.y + (this_00->super_Body).position_.y) - fStack_144;
        fVar16 = SQRT(fVar24 * fVar24 + fVar17 * fVar17);
        fVar24 = fVar24 / fVar16;
        fVar17 = fVar17 / fVar16;
        fVar22 = (((contacts.
                    super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>.
                    _M_impl.super__Vector_impl_data._M_start)->position).x - local_148) * fVar17 -
                 (((contacts.
                    super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>.
                    _M_impl.super__Vector_impl_data._M_start)->position).y - fStack_144) * fVar24;
        fVar16 = contacts.
                 super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>._M_impl
                 .super__Vector_impl_data._M_start[1].position.x;
        fVar18 = contacts.
                 super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>._M_impl
                 .super__Vector_impl_data._M_start[1].position.y;
        lVar8 = 9;
        pCVar11 = contacts.
                  super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pCVar12 = clipped_contacts.
                  super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (fVar22 <= 0.0) {
          for (; lVar8 != 0; lVar8 = lVar8 + -1) {
            pCVar12->position = pCVar11->position;
            pCVar11 = (pointer)((long)pCVar11 + (ulong)bVar13 * -0x10 + 8);
            pCVar12 = (pointer)((long)pCVar12 + (ulong)bVar13 * -0x10 + 8);
          }
          uVar9 = 1;
        }
        else {
          uVar9 = 0;
        }
        fVar16 = (fVar16 - local_148) * fVar17 - fVar24 * (fVar18 - fStack_144);
        uVar10 = uVar9;
        if (fVar16 <= 0.0) {
          uVar10 = uVar9 + 1;
          pCVar11 = contacts.
                    super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>.
                    _M_impl.super__Vector_impl_data._M_start + 1;
          pCVar12 = clipped_contacts.
                    super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>.
                    _M_impl.super__Vector_impl_data._M_start + uVar9;
          for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
            pCVar12->position = pCVar11->position;
            pCVar11 = (pointer)((long)pCVar11 + (ulong)bVar13 * -0x10 + 8);
            pCVar12 = (pointer)((long)pCVar12 + (ulong)bVar13 * -0x10 + 8);
          }
        }
        if (fVar22 * fVar16 < 0.0) {
          fVar18 = fVar22 - fVar16;
          auVar20._0_4_ =
               fVar22 * contacts.
                        super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>.
                        _M_impl.super__Vector_impl_data._M_start[1].position.x -
               fVar16 * ((contacts.
                          super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>
                          ._M_impl.super__Vector_impl_data._M_start)->position).x;
          auVar20._4_4_ =
               fVar22 * contacts.
                        super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>.
                        _M_impl.super__Vector_impl_data._M_start[1].position.y -
               fVar16 * ((contacts.
                          super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>
                          ._M_impl.super__Vector_impl_data._M_start)->position).y;
          auVar20._8_4_ = fVar22 * 0.0 - fVar16 * 0.0;
          auVar20._12_4_ = fVar22 * 0.0 - fVar16 * 0.0;
          auVar3._4_4_ = fVar18;
          auVar3._0_4_ = fVar18;
          auVar3._8_4_ = fVar18;
          auVar3._12_4_ = fVar18;
          auVar21 = divps(auVar20,auVar3);
          if ((NAN(auVar21._0_4_)) || (NAN(auVar21._4_4_))) {
            __assertion = "!std::isnan(v.x) && !std::isnan(v.y)";
            __line = 0x28;
LAB_001118f3:
            __assert_fail(__assertion,
                          "/workspace/llm4binary/github/license_c_cmakelists/wgtdkp[P]apollonia/src/collision.cc"
                          ,__line,
                          "size_t apollonia::Clip(Arbiter::ContactList &, const Arbiter::ContactList &, size_t, const Vec2 &, const Vec2 &)"
                         );
          }
          clipped_contacts.
          super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10].position = auVar21._0_8_;
          clipped_contacts.
          super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10].from_a._M_elems[0] = true;
          clipped_contacts.
          super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10].indices._M_elems[0] = idx_00;
          if (1 < uVar10) {
            __assertion = "num_out <= 2";
            __line = 0x2f;
            goto LAB_001118f3;
          }
          uVar10 = uVar10 + 1;
        }
        if ((uint)uVar10 < 2) goto LAB_00111897;
        std::vector<apollonia::Contact,_std::allocator<apollonia::Contact>_>::operator=
                  (&contacts,&clipped_contacts);
        idx_00 = idx_00 + 1;
      }
    }
    VVar4 = PolygonBody::operator[](this_00,ia);
    local_128._4_4_ = VVar4.y;
    fVar16 = (this_00->super_Body).position_.x;
    local_128._0_4_ = (float)local_128._4_4_ + (this_00->super_Body).position_.y;
    fStack_120 = (float)local_128._4_4_;
    fStack_11c = (float)local_128._4_4_;
    local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this = World::NewArbiter(&this_00->super_Body,&pb->super_Body,&normal,(ContactList *)&local_d8);
    std::_Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>::~_Vector_base
              (&local_d8);
    fVar18 = (float)local_128._0_4_;
    for (; clipped_contacts.
           super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>._M_impl.
           super__Vector_impl_data._M_start !=
           clipped_contacts.
           super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>._M_impl.
           super__Vector_impl_data._M_finish;
        clipped_contacts.super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>
        ._M_impl.super__Vector_impl_data._M_start =
             clipped_contacts.
             super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>._M_impl.
             super__Vector_impl_data._M_start + 1) {
      fVar17 = ((clipped_contacts.
                 super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>._M_impl
                 .super__Vector_impl_data._M_start)->position).x;
      fVar22 = ((clipped_contacts.
                 super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>._M_impl
                 .super__Vector_impl_data._M_start)->position).y;
      fVar24 = (fVar17 - (fVar16 + VVar4.x)) * normal.x + (fVar22 - fVar18) * normal.y;
      if (fVar24 <= 0.0) {
        (clipped_contacts.
         super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>._M_impl.
         super__Vector_impl_data._M_start)->separation = fVar24;
        VVar5 = (this_00->super_Body).centroid_;
        VVar1 = (this_00->super_Body).position_;
        VVar19.x = fVar17 - (VVar1.x + VVar5.x);
        VVar19.y = fVar22 - (VVar1.y + VVar5.y);
        (clipped_contacts.
         super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>._M_impl.
         super__Vector_impl_data._M_start)->ra = VVar19;
        VVar5 = (pb->super_Body).centroid_;
        VVar1 = (pb->super_Body).position_;
        VVar2.y = fVar22 - (VVar1.y + VVar5.y);
        VVar2.x = fVar17 - (VVar1.x + VVar5.x);
        (clipped_contacts.
         super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>._M_impl.
         super__Vector_impl_data._M_start)->rb = VVar2;
        Arbiter::AddContact(this,clipped_contacts.
                                 super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
        fVar18 = (float)local_128._0_4_;
      }
    }
LAB_00111897:
    std::_Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>::~_Vector_base
              (&clipped_contacts.
                super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>);
    std::_Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>::~_Vector_base
              (&contacts.super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>
              );
  }
  return this;
}

Assistant:

Arbiter* Collide(PolygonBody* pa, PolygonBody* pb) {
  size_t ia, ib;
  Float sa, sb;
  if ((sa = pa->FindMinSeparatingAxis(ia, *pb)) >= 0) {
    return nullptr;
  }
  if ((sb = pb->FindMinSeparatingAxis(ib, *pa)) >= 0) {
    return nullptr;
  }
  if (sa < sb) {
    std::swap(sa, sb);
    std::swap(ia, ib);
    std::swap(pa, pb);
  }
  auto& a = *pa;
  auto& b = *pb;
  auto normal = a.EdgeAt(ia).Normal();
  auto idx = FindIncidentEdge(normal, b);
  auto next_idx = (idx + 1) % b.Count();
  Arbiter::ContactList contacts = {{b, idx}, {b, next_idx}};
  auto clipped_contacts = contacts;
  for (size_t i = 0; i < a.Count(); ++i) {
    if (i == ia) {
      continue;
    }
    auto v0 = a.LocalToWorld(a[i]);
    auto v1 = a.LocalToWorld(a[(i+1)%a.Count()]);
    auto num = Clip(clipped_contacts, contacts, i, v0, v1);
    if (num < 2) {
      return nullptr;
    }
    assert(num == 2);
    contacts = clipped_contacts;
  }

  auto va = a.LocalToWorld(a[ia]);
  auto arbiter = World::NewArbiter(a, b, normal);
  for (auto& contact : clipped_contacts) {
    auto sep = Dot(contact.position - va, normal);
    if (sep <= 0) {
      contact.separation = sep;
      contact.ra = contact.position - a.LocalToWorld(a.centroid());
      contact.rb = contact.position - b.LocalToWorld(b.centroid());
      arbiter->AddContact(contact);
    }
  }
  return arbiter;
}